

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

size_t axl::err::pushError(ErrorRef *error)

{
  size_t sVar1;
  size_t result;
  Error stack;
  undefined8 local_70;
  ErrorRef *in_stack_ffffffffffffff98;
  Error *in_stack_ffffffffffffffa0;
  ErrorRef *in_stack_ffffffffffffffc0;
  Error *in_stack_ffffffffffffffc8;
  
  getLastError();
  Error::Error(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ErrorRef::~ErrorRef((ErrorRef *)0x17bc73);
  sVar1 = Error::push(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (sVar1 == 0xffffffffffffffff) {
    local_70 = 0xffffffffffffffff;
  }
  else {
    local_70 = setError((ErrorRef *)0x17bca5);
  }
  Error::~Error((Error *)0x17bcd9);
  return local_70;
}

Assistant:

size_t
pushError(const ErrorRef& error) {
	Error stack = getLastError();
	size_t result = stack.push(error);
	return result != -1 ? setError(stack) : -1;
}